

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::ReadV1_TCODE_MESH_OBJECT
          (ON_BinaryArchive *this,ON_Object **ppObject,ON_3dmObjectAttributes *pAttributes)

{
  bool bVar1;
  ON_MeshFace *pOVar2;
  size_t sVar3;
  int iVar4;
  ON_Mesh *this_00;
  byte bVar5;
  bool bHasTextureCoordinates;
  int point_count;
  int face_count;
  ON_3fPoint pt;
  ON_3dVector d;
  int boolHasTexCoordsAsInt;
  int boolHasVertexNormalsAsInt;
  unsigned_short xyz [3];
  ON__UINT32 tcode;
  ON_BoundingBox bbox;
  ON__INT64 big_value;
  ON__INT32 local_cc;
  ON__INT32 local_c8;
  ON_3fPoint local_c4;
  undefined1 local_b8 [6];
  ushort uStack_b2;
  float local_b0;
  int iStack_ac;
  double local_a8;
  ON__INT32 local_9c;
  ON__INT32 local_98;
  ushort local_92;
  ushort local_90;
  ushort local_8e;
  int local_8c;
  int local_88;
  uint local_84;
  double local_80;
  double local_78;
  double local_70;
  ON_BoundingBox local_68;
  ON__INT64 local_38;
  
  local_84 = 0;
  local_38 = 0;
  bVar1 = BeginRead3dmBigChunk(this,&local_84,&local_38);
  if (!bVar1) {
    return false;
  }
  bVar5 = 0;
  if (local_84 == 0x100017) {
    local_cc = 0;
    local_c8 = 0;
    local_98 = 0;
    local_9c = 0;
    ON_BoundingBox::ON_BoundingBox(&local_68);
    bVar1 = ReadInt32(this,1,&local_cc);
    if (bVar1) {
      this_00 = (ON_Mesh *)0x0;
      local_b8._0_4_ = CONCAT22(local_b8._2_2_,local_b8._0_2_);
      unique0x10000646 = (float)CONCAT22(uStack_b2,local_b8._4_2_);
      if (local_cc < 1) goto LAB_003aa308;
      bVar1 = ReadInt32(this,1,&local_c8);
      this_00 = (ON_Mesh *)0x0;
      bVar5 = 0;
      local_b8._0_4_ = CONCAT22(local_b8._2_2_,local_b8._0_2_);
      unique0x1000064a = (float)CONCAT22(uStack_b2,local_b8._4_2_);
      if ((!bVar1) ||
         (local_b8._0_4_ = CONCAT22(local_b8._2_2_,local_b8._0_2_),
         unique0x1000064e = (float)CONCAT22(uStack_b2,local_b8._4_2_), local_c8 < 1))
      goto LAB_003aa308;
      bVar1 = ReadInt32(this,1,&local_98);
      if ((!bVar1) ||
         (((bVar1 = ReadInt32(this,1,&local_9c), !bVar1 ||
           (bVar1 = ReadDouble(this,3,(double *)&local_68), !bVar1)) ||
          (bVar1 = ReadDouble(this,3,&local_68.m_max.x), !bVar1)))) goto LAB_003aa305;
      local_88 = local_98;
      bVar1 = local_98 != 0;
      local_8c = local_9c;
      bHasTextureCoordinates = local_9c != 0;
      this_00 = (ON_Mesh *)operator_new(0x6e0);
      ON_Mesh::ON_Mesh(this_00,local_c8,local_cc,bVar1,bHasTextureCoordinates);
      ON_BoundingBox::Diagonal((ON_3dVector *)local_b8,&local_68);
      if (0 < local_cc) {
        local_70 = (double)CONCAT26(uStack_b2,
                                    CONCAT24(local_b8._4_2_,CONCAT22(local_b8._2_2_,local_b8._0_2_))
                                   ) / 65535.0;
        local_78 = (double)CONCAT44(iStack_ac,local_b0) / 65535.0;
        local_80 = local_a8 / 65535.0;
        iVar4 = 0;
        do {
          bVar1 = ReadInt16(this,3,(ON__INT16 *)&local_92);
          if (!bVar1) break;
          local_c4.x = (float)((double)local_92 * local_70 +
                              (double)CONCAT71(local_68.m_min.x._1_7_,local_68.m_min.x._0_1_));
          local_c4.y = (float)((double)local_90 * local_78 + local_68.m_min.y);
          local_c4.z = (float)((double)local_8e * local_80 + local_68.m_min.z);
          ON_SimpleArray<ON_3fPoint>::Append
                    (&(this_00->m_V).super_ON_SimpleArray<ON_3fPoint>,&local_c4);
          iVar4 = iVar4 + 1;
        } while (iVar4 < local_cc);
      }
      if ((this_00->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count == local_cc) {
        if (local_cc < 0xffff) {
          if (0 < local_c8) {
            iVar4 = 0;
            do {
              bVar1 = ReadInt16(this,4,(ON__INT16 *)local_b8);
              if (!bVar1) break;
              pOVar2 = ON_SimpleArray<ON_MeshFace>::AppendNew(&this_00->m_F);
              pOVar2->vi[0] = (uint)(ushort)local_b8._0_2_;
              pOVar2->vi[1] = (uint)(ushort)local_b8._2_2_;
              pOVar2->vi[2] = (uint)(ushort)local_b8._4_2_;
              pOVar2->vi[3] = (uint)uStack_b2;
              iVar4 = iVar4 + 1;
            } while (iVar4 < local_c8);
          }
        }
        else if (0 < local_c8) {
          iVar4 = 0;
          do {
            bVar1 = ReadInt32(this,4,(ON__INT32 *)local_b8);
            if (!bVar1) break;
            pOVar2 = ON_SimpleArray<ON_MeshFace>::AppendNew(&this_00->m_F);
            pOVar2->vi[0] = CONCAT22(local_b8._2_2_,local_b8._0_2_);
            pOVar2->vi[1] = CONCAT22(uStack_b2,local_b8._4_2_);
            pOVar2->vi[2] = (int)local_b0;
            pOVar2->vi[3] = iStack_ac;
            iVar4 = iVar4 + 1;
          } while (iVar4 < local_c8);
        }
        if ((this_00->m_F).m_count == local_c8) {
          if (local_88 != 0) {
            if (0 < local_cc) {
              iVar4 = 0;
              do {
                sVar3 = Read(this,3,&local_c4);
                if (sVar3 != 3) break;
                local_b8._0_4_ = (float)(int)local_c4.x._0_1_ / 127.0;
                unique0x10000269 = (float)(int)local_c4.x._1_1_ / 127.0;
                local_b0 = (float)(int)local_c4.x._2_1_ / 127.0;
                ON_SimpleArray<ON_3fVector>::Append
                          (&(this_00->m_N).super_ON_SimpleArray<ON_3fVector>,(ON_3fVector *)local_b8
                          );
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_cc);
            }
            if ((this_00->m_N).super_ON_SimpleArray<ON_3fVector>.m_count !=
                (this_00->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count) goto LAB_003aa527;
          }
          if (local_8c != 0) {
            if (0 < local_cc) {
              iVar4 = 0;
              do {
                bVar1 = ReadInt16(this,2,(ON__INT16 *)&local_c4);
                if (!bVar1) break;
                local_b8._0_4_ = (float)((uint)local_c4.x & 0xffff) / 65535.0;
                unique0x100002a9 = (float)((uint)local_c4.x >> 0x10) / 65535.0;
                ON_SimpleArray<ON_2fPoint>::Append
                          (&(this_00->m_T).super_ON_SimpleArray<ON_2fPoint>,(ON_2fPoint *)local_b8);
                iVar4 = iVar4 + 1;
              } while (iVar4 < local_cc);
            }
            if ((this_00->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count !=
                (this_00->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count) goto LAB_003aa527;
          }
          bVar5 = 1;
          goto LAB_003aa308;
        }
      }
LAB_003aa527:
      bVar5 = 0;
      goto LAB_003aa308;
    }
  }
LAB_003aa305:
  bVar5 = 0;
  this_00 = (ON_Mesh *)0x0;
LAB_003aa308:
  bVar1 = EndRead3dmChunk(this,false);
  bVar1 = (bool)(this_00 != (ON_Mesh *)0x0 & bVar1 & bVar5);
  if (bVar1 == true) {
    *ppObject = (ON_Object *)this_00;
  }
  else if (this_00 != (ON_Mesh *)0x0) {
    (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_00);
  }
  if (bVar1 != false) {
    local_68.m_min.x._0_1_ = 0;
    Read3dmV1AttributesOrMaterial
              (this,pAttributes,(ON_Material *)0x0,(bool *)&local_68,0xffffffff,
               (ON__3dmV1_XDATA *)0x0);
  }
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::ReadV1_TCODE_MESH_OBJECT(
                                                ON_Object** ppObject,
                                                ON_3dmObjectAttributes* pAttributes
                                                )
{
  ON_Mesh* mesh = 0;
  bool rc = false;
  // read v1 mesh
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  int i;
  if ( !BeginRead3dmBigChunk(&tcode,&big_value) )
    return false;
  
  if ( tcode == TCODE_COMPRESSED_MESH_GEOMETRY ) for(;;) 
  {
    
    int point_count = 0;
    int face_count = 0;
    int boolHasVertexNormalsAsInt = false;
    int boolHasTexCoordsAsInt = false;
    ON_BoundingBox bbox;
    
    if (!ReadInt(&point_count) )
      break;
    if ( point_count <= 0 )
      break;
    if (!ReadInt(&face_count) )
      break;
    if ( face_count <= 0 )
      break;
    if (!ReadInt(&boolHasVertexNormalsAsInt) )
      break;
    if (!ReadInt(&boolHasTexCoordsAsInt) )
      break;
    if ( !ReadPoint(bbox.m_min) )
      break;
    if ( !ReadPoint(bbox.m_max) )
      break;

    const bool bHasVertexNormals = boolHasVertexNormalsAsInt ? true : false;
    const bool bHasTexCoords = boolHasTexCoordsAsInt ? true : false;

    mesh = new ON_Mesh(face_count,
                       point_count,
                       bHasVertexNormals,
                       bHasTexCoords
                       );

    // read 3d vertex locations
    {
      ON_3dVector d = bbox.Diagonal();
      double dx = d.x / 65535.0;
      double dy = d.y / 65535.0;
      double dz = d.z / 65535.0;
      unsigned short xyz[3];
      ON_3fPoint pt;
      for ( i = 0; i < point_count; i++ ) {
        if ( !ReadShort(3,xyz) )
          break;
        pt.x = (float)(dx*xyz[0] + bbox.m_min.x);
        pt.y = (float)(dy*xyz[1] + bbox.m_min.y);
        pt.z = (float)(dz*xyz[2] + bbox.m_min.z);
        mesh->m_V.Append(pt);
      }
    }
    if ( mesh->m_V.Count() != point_count )
      break;

    // read triangle/quadrangle faces
    if ( point_count < 65535 ) {
      unsigned short abcd[4];
      for ( i = 0; i < face_count; i++ ) {
        if ( !ReadShort(4,abcd) )
          break;
        ON_MeshFace& f = mesh->m_F.AppendNew();
        f.vi[0] = abcd[0];
        f.vi[1] = abcd[1];
        f.vi[2] = abcd[2];
        f.vi[3] = abcd[3];
      }
    }
    else {
      int abcd[4];
      for ( i = 0; i < face_count; i++ ) {
        if ( !ReadInt(4,abcd) )
          break;
        ON_MeshFace& f = mesh->m_F.AppendNew();
        f.vi[0] = abcd[0];
        f.vi[1] = abcd[1];
        f.vi[2] = abcd[2];
        f.vi[3] = abcd[3];
      }
    }
    if ( mesh->m_F.Count() != face_count )
      break;

    if ( bHasVertexNormals ) {
      char xyz[3];
      ON_3fVector normal;
      for ( i = 0; i < point_count; i++ ) {
        if ( !ReadChar(3,xyz) )
          break;
        normal.x = (float)(((signed char)xyz[0])/127.0);
        normal.y = (float)(((signed char)xyz[1])/127.0);
        normal.z = (float)(((signed char)xyz[2])/127.0);
        mesh->m_N.Append(normal);
      }
      if ( mesh->m_N.Count() != mesh->m_V.Count() )
        break;
    }

    if ( bHasTexCoords ) {
      unsigned short uv[2];
      ON_2fPoint t;
      for ( i = 0; i < point_count; i++ ) {
        if ( !ReadShort(2,uv) )
          break;
        t.x = (float)(uv[0]/65535.0);
        t.y = (float)(uv[1]/65535.0);
        mesh->m_T.Append(t);
      }
      if ( mesh->m_T.Count() != mesh->m_V.Count() )
        break;
    }

    rc = true;

    break;
  }
  
  if ( !EndRead3dmChunk() )
    rc = false;

  if ( rc && mesh ) {
    *ppObject = mesh;
  }
  else {
    if ( mesh )
      delete mesh;
    rc = false;
  }

  if ( rc && mesh ) {
    // attributes and material information follows the TCODE_COMPRESSED_MESH_GEOMETRY chunk;
    bool bHaveMat = false;
    Read3dmV1AttributesOrMaterial(pAttributes,nullptr,bHaveMat,TCODE_ENDOFTABLE);
  }

  return rc;
}